

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parson.c
# Opt level: O2

JSON_Value * json_value_init_object(void)

{
  JSON_Value *pJVar1;
  JSON_Object *pJVar2;
  
  pJVar1 = (JSON_Value *)(*parson_malloc)(0x20);
  if (pJVar1 != (JSON_Value *)0x0) {
    pJVar1->parent = (JSON_Value *)0x0;
    pJVar1->type = 4;
    pJVar2 = (JSON_Object *)(*parson_malloc)(0x48);
    if (pJVar2 != (JSON_Object *)0x0) {
      pJVar2->wrapping_value = pJVar1;
      pJVar2->cells = (size_t *)0x0;
      pJVar2->hashes = (unsigned_long *)0x0;
      pJVar2->names = (char **)0x0;
      pJVar2->values = (JSON_Value **)0x0;
      pJVar2->cell_ixs = (size_t *)0x0;
      pJVar2->count = 0;
      pJVar2->item_capacity = 0;
      pJVar2->cell_capacity = 0;
      (pJVar1->value).object = pJVar2;
      return pJVar1;
    }
    (pJVar1->value).string.chars = (char *)0x0;
    (*parson_free)(pJVar1);
  }
  return (JSON_Value *)0x0;
}

Assistant:

JSON_Value * json_value_init_object(void) {
    JSON_Value *new_value = (JSON_Value*)parson_malloc(sizeof(JSON_Value));
    if (!new_value) {
        return NULL;
    }
    new_value->parent = NULL;
    new_value->type = JSONObject;
    new_value->value.object = json_object_make(new_value);
    if (!new_value->value.object) {
        parson_free(new_value);
        return NULL;
    }
    return new_value;
}